

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall SuiteMessageTests::TestisApp::TestisApp(TestisApp *this)

{
  char *suiteName;
  TestisApp *this_local;
  
  suiteName = SuiteMessageTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"isApp",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x58);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestisApp_00458830;
  return;
}

Assistant:

TEST(isApp)
{
  FIX::Message object;
  CHECK( !object.isApp() );
  object.getHeader().setField( FIX::MsgType("A") );
  CHECK( !object.isApp() );
  object.getHeader().setField( FIX::MsgType("D") );
  CHECK( object.isApp() );
}